

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

format_arg * __thiscall
fmt::v6::
basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
::get<char>(format_arg *__return_storage_ptr__,
           basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
           *this,basic_string_view<char> name)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  int *piVar5;
  long lVar6;
  
  uVar3 = name.size_;
  if ((this->desc_ >> 0x3e & 1) != 0) {
    uVar4 = (ulong)(-1 < (long)this->desc_) << 4 | 0xffffffffffffffe0;
    lVar6 = *(long *)((long)&((this->field_1).values_)->field_0 + uVar4 + 8);
    if (lVar6 != 0) {
      piVar5 = (int *)(*(long *)((long)&((this->field_1).values_)->field_0 + uVar4) + 8);
      do {
        __s = *(char **)(piVar5 + -2);
        sVar2 = strlen(__s);
        __n = sVar2;
        if (uVar3 <= sVar2) {
          __n = uVar3;
        }
        if (__n == 0) {
          if (sVar2 == uVar3) goto LAB_0010dae1;
        }
        else {
          iVar1 = bcmp(__s,name.data_,__n);
          if (iVar1 == 0 && sVar2 == uVar3) {
LAB_0010dae1:
            get(__return_storage_ptr__,this,*piVar5);
            return __return_storage_ptr__;
          }
        }
        piVar5 = piVar5 + 4;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  (__return_storage_ptr__->value_).field_0.int_value = 0;
  __return_storage_ptr__->type_ = none_type;
  return __return_storage_ptr__;
}

Assistant:

format_arg get(basic_string_view<Char> name) const {
    if (!has_named_args()) return {};
    const auto& named_args =
        (is_packed() ? values_[-1] : args_[-1].value_).named_args;
    for (size_t i = 0; i < named_args.size; ++i) {
      if (named_args.data[i].name == name) return get(named_args.data[i].id);
    }
    return {};
  }